

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

stack_st_OPENSSL_STRING * get_email(X509_NAME *name,GENERAL_NAMES *gens)

{
  int iVar1;
  X509_NAME_ENTRY *ne_00;
  ASN1_STRING *email_00;
  GENERAL_NAME *pGVar2;
  GENERAL_NAME *gen;
  size_t j;
  ASN1_IA5STRING *email;
  X509_NAME_ENTRY *ne;
  stack_st_OPENSSL_STRING *psStack_28;
  int i;
  stack_st_OPENSSL_STRING *ret;
  GENERAL_NAMES *gens_local;
  X509_NAME *name_local;
  
  psStack_28 = (stack_st_OPENSSL_STRING *)0x0;
  ne._4_4_ = -1;
  ret = (stack_st_OPENSSL_STRING *)gens;
  gens_local = (GENERAL_NAMES *)name;
  do {
    ne._4_4_ = X509_NAME_get_index_by_NID((X509_NAME *)gens_local,0x30,ne._4_4_);
    if (ne._4_4_ < 0) {
      gen = (GENERAL_NAME *)0x0;
      while( true ) {
        pGVar2 = (GENERAL_NAME *)sk_GENERAL_NAME_num((stack_st_GENERAL_NAME *)ret);
        if (pGVar2 <= gen) {
          return psStack_28;
        }
        pGVar2 = sk_GENERAL_NAME_value((stack_st_GENERAL_NAME *)ret,(size_t)gen);
        if ((pGVar2->type == 1) &&
           (iVar1 = append_ia5(&stack0xffffffffffffffd8,(pGVar2->d).rfc822Name), iVar1 == 0)) break;
        gen = (GENERAL_NAME *)((long)&gen->type + 1);
      }
      return (stack_st_OPENSSL_STRING *)0x0;
    }
    ne_00 = X509_NAME_get_entry((X509_NAME *)gens_local,ne._4_4_);
    email_00 = X509_NAME_ENTRY_get_data(ne_00);
    iVar1 = append_ia5(&stack0xffffffffffffffd8,(ASN1_IA5STRING *)email_00);
  } while (iVar1 != 0);
  return (stack_st_OPENSSL_STRING *)0x0;
}

Assistant:

static STACK_OF(OPENSSL_STRING) *get_email(const X509_NAME *name,
                                           const GENERAL_NAMES *gens) {
  STACK_OF(OPENSSL_STRING) *ret = NULL;
  // Now add any email address(es) to STACK
  int i = -1;
  // First supplied X509_NAME
  while ((i = X509_NAME_get_index_by_NID(name, NID_pkcs9_emailAddress, i)) >=
         0) {
    const X509_NAME_ENTRY *ne = X509_NAME_get_entry(name, i);
    const ASN1_IA5STRING *email = X509_NAME_ENTRY_get_data(ne);
    if (!append_ia5(&ret, email)) {
      return NULL;
    }
  }
  for (size_t j = 0; j < sk_GENERAL_NAME_num(gens); j++) {
    const GENERAL_NAME *gen = sk_GENERAL_NAME_value(gens, j);
    if (gen->type != GEN_EMAIL) {
      continue;
    }
    if (!append_ia5(&ret, gen->d.ia5)) {
      return NULL;
    }
  }
  return ret;
}